

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)1>::decode4
          (Predecoder<(InstructionSet::M68k::Model)1> *this,uint16_t instruction)

{
  ushort uVar1;
  Preinstruction PVar2;
  uint16_t instruction_local;
  Predecoder<(InstructionSet::M68k::Model)1> *this_local;
  
  switch(instruction & 0xfff) {
  case 0xe70:
    this_local._4_4_ = decode<(unsigned_char)136,true>(this,instruction);
    break;
  case 0xe71:
    this_local._4_4_ = decode<(unsigned_char)1,true>(this,instruction);
    break;
  case 0xe72:
    this_local._4_4_ = decode<(unsigned_char)135,true>(this,instruction);
    break;
  case 0xe73:
    this_local._4_4_ = decode<(unsigned_char)123,true>(this,instruction);
    break;
  case 0xe74:
    this_local._4_4_ = decode<(unsigned_char)144,true>(this,instruction);
    break;
  case 0xe75:
    this_local._4_4_ = decode<(unsigned_char)53,true>(this,instruction);
    break;
  case 0xe76:
    this_local._4_4_ = decode<(unsigned_char)126,true>(this,instruction);
    break;
  case 0xe77:
    this_local._4_4_ = decode<(unsigned_char)124,true>(this,instruction);
    break;
  default:
    uVar1 = instruction & 0xff8;
    if (uVar1 != 0x808) {
      if (uVar1 == 0x840) {
        PVar2 = decode<(unsigned_char)129,true>(this,instruction);
        return PVar2;
      }
      if (uVar1 == 0x848) {
        PVar2 = decode<(unsigned_char)143,true>(this,instruction);
        return PVar2;
      }
      if (uVar1 == 0x880) {
        PVar2 = decode<(unsigned_char)131,true>(this,instruction);
        return PVar2;
      }
      if (uVar1 == 0x8c0) {
        PVar2 = decode<(unsigned_char)132,true>(this,instruction);
        return PVar2;
      }
      if (uVar1 != 0x9c0) {
        if (uVar1 == 0xe50) {
          PVar2 = decode<(unsigned_char)133,true>(this,instruction);
          return PVar2;
        }
        if (uVar1 == 0xe58) {
          PVar2 = decode<(unsigned_char)134,true>(this,instruction);
          return PVar2;
        }
        if (uVar1 == 0xe60) {
          PVar2 = decode<(unsigned_char)31,true>(this,instruction);
          return PVar2;
        }
        if (uVar1 == 0xe68) {
          PVar2 = decode<(unsigned_char)32,true>(this,instruction);
          return PVar2;
        }
      }
    }
    if ((instruction & 0xff0) == 0xe40) {
      this_local._4_4_ = decode<(unsigned_char)125,true>(this,instruction);
    }
    else {
      uVar1 = instruction & 0xfc0;
      if ((instruction & 0xfc0) == 0) {
        this_local._4_4_ = decode<(unsigned_char)63,true>(this,instruction);
      }
      else if (uVar1 == 0x40) {
        this_local._4_4_ = decode<(unsigned_char)64,true>(this,instruction);
      }
      else if (uVar1 == 0x80) {
        this_local._4_4_ = decode<(unsigned_char)65,true>(this,instruction);
      }
      else if (uVar1 == 0xc0) {
        this_local._4_4_ = decode<(unsigned_char)29,true>(this,instruction);
      }
      else if (uVar1 == 0x200) {
        this_local._4_4_ = decode<(unsigned_char)60,true>(this,instruction);
      }
      else if (uVar1 == 0x240) {
        this_local._4_4_ = decode<(unsigned_char)61,true>(this,instruction);
      }
      else if (uVar1 == 0x280) {
        this_local._4_4_ = decode<(unsigned_char)62,true>(this,instruction);
      }
      else if (uVar1 == 0x2c0) {
        this_local._4_4_ = decode<(unsigned_char)137,true>(this,instruction);
      }
      else if (uVar1 == 0x400) {
        this_local._4_4_ = decode<(unsigned_char)66,true>(this,instruction);
      }
      else if (uVar1 == 0x440) {
        this_local._4_4_ = decode<(unsigned_char)67,true>(this,instruction);
      }
      else if (uVar1 == 0x480) {
        this_local._4_4_ = decode<(unsigned_char)68,true>(this,instruction);
      }
      else if (uVar1 == 0x4c0) {
        this_local._4_4_ = decode<(unsigned_char)30,true>(this,instruction);
      }
      else if (uVar1 == 0x600) {
        this_local._4_4_ = decode<(unsigned_char)113,true>(this,instruction);
      }
      else if (uVar1 == 0x640) {
        this_local._4_4_ = decode<(unsigned_char)114,true>(this,instruction);
      }
      else if (uVar1 == 0x680) {
        this_local._4_4_ = decode<(unsigned_char)115,true>(this,instruction);
      }
      else if (uVar1 == 0x6c0) {
        this_local._4_4_ = decode<(unsigned_char)28,true>(this,instruction);
      }
      else if (uVar1 == 0x800) {
        this_local._4_4_ = decode<(unsigned_char)4,true>(this,instruction);
      }
      else if (uVar1 == 0x840) {
        this_local._4_4_ = decode<(unsigned_char)27,true>(this,instruction);
      }
      else if (uVar1 == 0x880) {
        this_local._4_4_ = decode<(unsigned_char)104,true>(this,instruction);
      }
      else if (uVar1 == 0x8c0) {
        this_local._4_4_ = decode<(unsigned_char)103,true>(this,instruction);
      }
      else if (uVar1 == 0xa00) {
        this_local._4_4_ = decode<(unsigned_char)48,true>(this,instruction);
      }
      else if (uVar1 == 0xa40) {
        this_local._4_4_ = decode<(unsigned_char)49,true>(this,instruction);
      }
      else if (uVar1 == 0xa80) {
        this_local._4_4_ = decode<(unsigned_char)50,true>(this,instruction);
      }
      else if (uVar1 == 0xac0) {
        this_local._4_4_ = decode<(unsigned_char)130,true>(this,instruction);
      }
      else {
        if ((uVar1 != 0xc00) && (uVar1 != 0xc40)) {
          if (uVar1 == 0xc80) {
            PVar2 = decode<(unsigned_char)102,true>(this,instruction);
            return PVar2;
          }
          if (uVar1 == 0xcc0) {
            PVar2 = decode<(unsigned_char)101,true>(this,instruction);
            return PVar2;
          }
          if (uVar1 == 0xe80) {
            PVar2 = decode<(unsigned_char)52,true>(this,instruction);
            return PVar2;
          }
          if (uVar1 == 0xec0) {
            PVar2 = decode<(unsigned_char)51,true>(this,instruction);
            return PVar2;
          }
        }
        uVar1 = instruction & 0x1c0;
        if (uVar1 != 0x100) {
          if (uVar1 == 0x180) {
            PVar2 = decode<(unsigned_char)127,true>(this,instruction);
            return PVar2;
          }
          if (uVar1 == 0x1c0) {
            PVar2 = decode<(unsigned_char)26,true>(this,instruction);
            return PVar2;
          }
        }
        memset((void *)((long)&this_local + 4),0,4);
        Preinstruction::Preinstruction((Preinstruction *)((long)&this_local + 4));
      }
    }
    break;
  case 0xe7a:
    this_local._4_4_ = decode<(unsigned_char)138,true>(this,instruction);
    break;
  case 0xe7b:
    this_local._4_4_ = decode<(unsigned_char)139,true>(this,instruction);
  }
  return this_local._4_4_;
}

Assistant:

Preinstruction Predecoder<model>::decode4(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0xfff) {
		case 0xe70:	Decode(Op::RESET);	// 6-83 (p537)
		case 0xe71:	Decode(Op::NOP);	// 4-147 (p251)
		case 0xe72:	Decode(Op::STOP);	// 6-85 (p539)
		case 0xe73:	Decode(Op::RTE);	// 6-84 (p538)
		case 0xe74:	DecodeReq(model >= Model::M68010, Op::RTD);		// 4-166 (p270)
		case 0xe75:	Decode(Op::RTS);	// 4-169 (p273)
		case 0xe76:	Decode(Op::TRAPV);	// 4-191 (p295)
		case 0xe77:	Decode(Op::RTR);	// 4-168 (p272)
		case 0xe7a: DecodeReq(model >= Model::M68010, Op::MOVEtoC);		// 6-22 (p476)
		case 0xe7b: DecodeReq(model >= Model::M68010, Op::MOVEfromC);	// 6-22 (p476)
		default:	break;
	}

	switch(instruction & 0xff8) {
		case 0x840:	Decode(Op::SWAP);			// 4-185 (p289)
		case 0x848: DecodeReq(model >= Model::M68010, Op::BKPT);	// 4-54 (p158)
		case 0xe58:	Decode(Op::UNLINK);			// 4-194 (p298)
		case 0xe60:	Decode(Op::MOVEtoUSP);		// 6-21 (p475)
		case 0xe68:	Decode(Op::MOVEfromUSP);	// 6-21 (p475)

		// 4-106 (p210)
		case 0x880:	Decode(Op::EXTbtow);
		case 0x8c0:	Decode(Op::EXTwtol);
		case 0x9c0:	DecodeReq(model >= Model::M68020, Op::EXTbtol);

		// 4-111 (p215)
		case 0x808:	DecodeReq(model >= Model::M68020, Op::LINKl);
		case 0xe50:	Decode(Op::LINKw);

		default:	break;
	}

	switch(instruction & 0xff0) {
		case 0xe40:	Decode(Op::TRAP);		// 4-188 (p292)
		default:	break;
	}

	switch(instruction & 0xfc0) {
		// 4-146 (p250)
		case 0x000:	Decode(Op::NEGXb);
		case 0x040:	Decode(Op::NEGXw);
		case 0x080:	Decode(Op::NEGXl);

		// 6-17 (p471)
		case 0x0c0:	Decode(Op::MOVEfromSR);

		// 4-73 (p177)
		case 0x200:	Decode(Op::CLRb);
		case 0x240:	Decode(Op::CLRw);
		case 0x280:	Decode(Op::CLRl);

		// 4-144 (p247)
		case 0x400:	Decode(Op::NEGb);
		case 0x440:	Decode(Op::NEGw);
		case 0x480:	Decode(Op::NEGl);

		// 4-123 (p227)
		case 0x4c0:	Decode(Op::MOVEtoCCR);

		// 4-148 (p252)
		case 0x600:	Decode(Op::NOTb);
		case 0x640:	Decode(Op::NOTw);
		case 0x680:	Decode(Op::NOTl);

		// 4-123 (p227)
		case 0x6c0:	Decode(Op::MOVEtoSR);

		// 4-142 (p246)
		case 0x800:	Decode(Op::NBCD);

		// 4-159 (p263)
		case 0x840:	Decode(Op::PEA);

		// 4-128 (p232)
		case 0x880:	Decode(Op::MOVEMtoMw);
		case 0x8c0:	Decode(Op::MOVEMtoMl);
		case 0xc80:	Decode(Op::MOVEMtoRw);
		case 0xcc0:	Decode(Op::MOVEMtoRl);

		// 4-192 (p296)
		case 0xa00:	Decode(Op::TSTb);
		case 0xa40:	Decode(Op::TSTw);
		case 0xa80:	Decode(Op::TSTl);

		// 4-186 (p290)
		case 0xac0:	Decode(Op::TAS);

		// 4-109 (p213)
		case 0xe80:	Decode(Op::JSR);

		// 4-108 (p212)
		case 0xec0:	Decode(Op::JMP);

		// 4-94 (p198) [DIVS.l]; 4-98 (p202) [DIVU.l]
		case 0xc40:	DecodeReq(model >= Model::M68020, Op::DIVSorDIVUl);

		// 4-137 (p241) [MULS.l]; 4-140 (p244) [MULU.l]
		case 0xc00:	DecodeReq(model >= Model::M68020, Op::MULSorMULUl);

		// 4-121 (p225)
		case 0x2c0: DecodeReq(model >= Model::M68010, Op::MOVEfromCCR);

		default:	break;
	}

	switch(instruction & 0x1c0) {
		case 0x1c0:	Decode(Op::LEA);	// 4-110 (p214)

		// 4-69 (p173)
		case 0x180:	Decode(Op::CHKw);
		case 0x100:	DecodeReq(model >= Model::M68020, Op::CHKl);

		default:	break;
	}

	return Preinstruction();
}